

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh_builder.cxx
# Opt level: O1

void __thiscall
xray_re::xr_mesh_builder::remove_back_faces(xr_mesh_builder *this,float normal_tolerance)

{
  uint32_t *puVar1;
  byte *pbVar2;
  vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_> *normals;
  uint uVar3;
  b_face *pbVar4;
  pointer pbVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  uint32_t uVar12;
  uint16_t uVar13;
  uint16_t uVar14;
  bool bVar15;
  void *__s;
  long lVar16;
  b_edge *pbVar17;
  long lVar18;
  uint32_t *puVar19;
  ulong uVar20;
  pointer pbVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  uint32_t *puVar25;
  uint uVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  void *pvVar30;
  ulong v0;
  pointer pbVar31;
  b_face *pbVar32;
  ulong uVar33;
  xr_mesh_builder *this_00;
  int side;
  vector<unsigned_int,_std::allocator<unsigned_int>_> adjacents;
  vector<int,_std::allocator<int>_> sides;
  int local_d4;
  b_face *local_d0;
  ulong local_c8;
  b_face *local_c0;
  uint local_b4;
  void *local_b0;
  void *local_a8;
  uint local_9c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  long local_78;
  b_edge *local_70;
  xr_mesh_builder *local_68;
  pointer local_60;
  vector<int,_std::allocator<int>_> local_58;
  ulong local_40;
  ulong local_38;
  
  local_b0 = (void *)CONCAT44(local_b0._4_4_,normal_tolerance);
  generate_vertex_faces(this);
  pbVar32 = (this->m_faces).
            super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (this->m_faces).
           super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_40 = (long)pbVar4 - (long)pbVar32 >> 6;
  local_c8 = -(ulong)(local_40 >> 0x3e != 0) | (long)pbVar4 - (long)pbVar32 >> 4;
  local_68 = this;
  local_a8 = operator_new__(local_c8);
  local_78 = (long)pbVar4 - (long)pbVar32;
  local_d0 = pbVar4;
  local_c0 = pbVar32;
  if (local_78 != 0) {
    memset(local_a8,0xff,local_78 >> 4 & 0xfffffffffffffffc);
  }
  if (local_c0 != local_d0) {
    local_60 = (pointer)(local_68->m_vertex_faces).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start;
    normals = &local_68->m_normals;
    local_70 = (b_edge *)&local_c0->field_1;
    uVar33 = 0;
    pbVar32 = local_c0;
    do {
      uVar28 = (ulong)(local_60->field_0).__refs[(pbVar32->field_0).field_0.v[0]];
      do {
        if (uVar28 == 0xffffffff) break;
        bVar15 = b_face::is_back(pbVar32,local_c0 + uVar28,normals,local_b0._0_4_);
        if (bVar15) {
          *(int *)((long)local_a8 + uVar33 * 4) = (int)uVar28;
          *(int *)((long)local_a8 + uVar28 * 4) = (int)uVar33;
        }
        else {
          lVar16 = 0;
          do {
            lVar18 = lVar16;
            if (lVar18 == -3) {
              uVar28 = 0;
              goto LAB_0017482d;
            }
            lVar16 = lVar18 + -1;
          } while (*(uint32_t *)((long)local_70 + lVar18 * 4 + uVar28 * 0x40 + -0x28) !=
                   (pbVar32->field_0).field_0.v[0]);
          uVar28 = (ulong)*(uint *)((long)local_70 + (lVar18 + -1) * 4 + uVar28 * 0x40);
LAB_0017482d:
          if (lVar18 == -3) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh_builder.h"
                          ,0xa4,
                          "uint32_t xray_re::xr_mesh_builder::b_face::next_face_idx(uint_fast32_t) const"
                         );
          }
        }
      } while (!bVar15);
      pbVar32 = pbVar32 + 1;
      uVar33 = (ulong)((int)uVar33 + 1);
    } while (pbVar32 != local_d0);
  }
  this_00 = local_68;
  create_edges(local_68,false);
  local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (uint *)0x0;
  local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&local_98,0x200);
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  std::vector<int,_std::allocator<int>_>::reserve(&local_58,0x100);
  __s = operator_new__(local_c8);
  uVar33 = local_40;
  pvVar30 = local_a8;
  if (local_d0 != local_c0) {
    memset(__s,0xff,local_78 >> 4 & 0xfffffffffffffffc);
  }
  if (local_d0 != local_c0) {
    local_c8 = 0;
    uVar28 = 0;
    local_b0 = __s;
LAB_001748ff:
    if ((*(int *)((long)pvVar30 + uVar28 * 4) != -1) && (*(int *)((long)__s + uVar28 * 4) == -1)) {
      local_d4 = 0;
      local_9c = (uint)uVar28;
      lVar16 = (uVar28 & 0xffffffff) * 4;
      *(int *)((long)__s + lVar16) = (int)local_c8;
      iVar22 = (int)local_c8 + 1;
      local_78 = CONCAT44(local_78._4_4_,iVar22);
      *(int *)((long)__s + (ulong)*(uint *)((long)pvVar30 + lVar16) * 4) = iVar22;
      local_38 = uVar28;
      do {
        uVar29 = (ulong)local_9c;
        pbVar21 = (this_00->m_faces).
                  super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_60 = pbVar21 + uVar29;
        pbVar32 = (b_face *)0x3;
        uVar28 = (ulong)pbVar21[uVar29].field_0.field_0.v[0];
        do {
          uVar26 = *(uint *)((long)local_60 + (long)pbVar32 * 4 + -4);
          v0 = (ulong)uVar26;
          pbVar17 = find_edge(this_00,v0,uVar28);
          if ((pbVar17 == (b_edge *)0x0) || (uVar28 != pbVar17->v1 && uVar26 != pbVar17->v1)) {
            __assert_fail("edge && (v0 == edge->v1 || v1 == edge->v1)",
                          "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh_builder.cxx"
                          ,0x14c,"void xray_re::xr_mesh_builder::remove_back_faces(float)");
          }
          local_c0 = pbVar32;
          local_70 = pbVar17;
          if (pbVar17->size < 5) {
            uVar33 = (ulong)pbVar17->face0;
            do {
              if (uVar33 == 0xffffffff) break;
              pbVar32 = (local_68->m_faces).
                        super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar33;
              if (((uVar33 == uVar29) || (uVar33 == *(uint *)((long)local_a8 + uVar29 * 4))) ||
                 (*(int *)((long)local_b0 + uVar33 * 4) != -1)) {
LAB_00174afb:
                lVar16 = 3;
                do {
                  lVar18 = lVar16;
                  lVar16 = lVar18 + -1;
                  if (lVar18 == 0) break;
                } while (*(uint *)((long)pbVar32 + lVar16 * 4) != uVar26);
                if (lVar18 == 0) {
LAB_00174d4d:
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh_builder.h"
                                ,0x9a,
                                "uint_fast32_t xray_re::xr_mesh_builder::b_face::local_vert_idx(uint_fast32_t) const"
                               );
                }
                lVar24 = 3;
                do {
                  lVar23 = lVar24;
                  lVar24 = lVar23 + -1;
                  if (lVar23 == 0) break;
                } while (uVar28 != *(uint *)((long)pbVar32 + lVar24 * 4));
                if (lVar23 == 0) goto LAB_00174d4d;
                if ((lVar16 == 0xffffffff) || (lVar24 == 0xffffffff)) {
                  __assert_fail("i0 != BAD_IDX && i1 != BAD_IDX",
                                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_mesh_builder.h"
                                ,0xac,
                                "uint32_t xray_re::xr_mesh_builder::b_face::next_face_idx(uint_fast32_t, uint_fast32_t) const"
                               );
                }
                lVar27 = lVar24 - lVar16;
                puVar1 = (pbVar32->field_0).field_0.link + 2;
                puVar19 = (uint32_t *)((long)&pbVar32->field_0 + lVar18 * 4 + 0x20);
                if (lVar27 == 2) {
                  puVar19 = puVar1;
                }
                puVar25 = (uint32_t *)((long)&pbVar32->field_0 + lVar23 * 4 + 0x20);
                if (lVar27 == -2) {
                  puVar25 = puVar1;
                }
                if (lVar24 != lVar16 && -1 < lVar27) {
                  puVar25 = puVar19;
                }
                uVar20 = (ulong)*puVar25;
                iVar22 = 0;
                if (uVar33 == uVar20) {
                  iVar22 = 0xf;
                }
              }
              else {
                bVar15 = b_face::is_same_layer(pbVar32,v0,uVar28);
                uVar3 = *(uint *)((long)local_a8 + uVar33 * 4);
                local_d0 = (b_face *)(ulong)uVar3;
                if (local_d0 == (b_face *)0xffffffff) {
                  iVar22 = 0;
                  if (3 < local_70->size) goto LAB_00174aec;
                  local_d4 = local_d4 + (-(uint)bVar15 | 1);
                  bVar15 = true;
                }
                else {
                  if (bVar15) {
                    local_b4 = (uint)uVar33;
                    if (local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish ==
                        local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                      _M_realloc_insert<unsigned_int>
                                (&local_98,
                                 (iterator)
                                 local_98.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,&local_b4);
                    }
                    else {
                      *local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish = local_b4;
                      local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish =
                           local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_finish + 1;
                    }
                    *(int *)((long)local_b0 + uVar33 * 4) = (int)local_c8;
                    *(undefined4 *)((long)local_b0 + (long)local_d0 * 4) = (undefined4)local_78;
                  }
                  else {
                    local_b4 = uVar3;
                    if (local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish ==
                        local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                      _M_realloc_insert<unsigned_int>
                                (&local_98,
                                 (iterator)
                                 local_98.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,&local_b4);
                    }
                    else {
                      *local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish = uVar3;
                      local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish =
                           local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_finish + 1;
                    }
                    *(int *)((long)local_b0 + (long)local_d0 * 4) = (int)local_c8;
                    *(undefined4 *)((long)local_b0 + uVar33 * 4) = (undefined4)local_78;
                  }
LAB_00174aec:
                  iVar22 = 0xf;
                  bVar15 = false;
                }
                uVar20 = uVar33;
                if (bVar15) goto LAB_00174afb;
              }
              uVar33 = uVar20;
            } while (iVar22 == 0);
          }
          uVar33 = local_40;
          this_00 = local_68;
          pvVar30 = local_a8;
          __s = local_b0;
          pbVar32 = (b_face *)((long)&local_c0[-1].sector + 1);
          uVar28 = v0;
        } while (pbVar32 != (b_face *)0x0);
        if (local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start ==
            local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish) goto code_r0x00174bcd;
        local_9c = local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1];
        local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
      } while( true );
    }
    goto LAB_00174c43;
  }
LAB_00174c4f:
  pbVar21 = (this_00->m_faces).
            super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar5 = (this_00->m_faces).
           super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar21 != pbVar5) {
    uVar26 = 0;
    pbVar31 = pbVar21;
    do {
      if (*(int *)((long)pvVar30 + (ulong)uVar26 * 4) == -1) {
LAB_00174c9d:
        if (pbVar31 != pbVar21) {
          uVar6 = *(undefined8 *)&pbVar31->field_0;
          uVar7 = *(undefined8 *)((long)&pbVar31->field_0 + 8);
          uVar8 = *(undefined8 *)((long)&pbVar31->field_0 + 0x10);
          uVar9 = *(undefined8 *)((long)&pbVar31->field_0 + 0x18);
          uVar10 = *(undefined8 *)((long)&pbVar31->field_0 + 0x20);
          uVar11 = *(undefined8 *)((long)&pbVar31->field_0 + 0x28);
          uVar12 = pbVar31->tag;
          uVar13 = pbVar31->temp;
          uVar14 = pbVar31->sector;
          pbVar21->field_1 = pbVar31->field_1;
          pbVar21->tag = uVar12;
          pbVar21->temp = uVar13;
          pbVar21->sector = uVar14;
          *(undefined8 *)((long)&pbVar21->field_0 + 0x20) = uVar10;
          *(undefined8 *)((long)&pbVar21->field_0 + 0x28) = uVar11;
          *(undefined8 *)((long)&pbVar21->field_0 + 0x10) = uVar8;
          *(undefined8 *)((long)&pbVar21->field_0 + 0x18) = uVar9;
          *(undefined8 *)&pbVar21->field_0 = uVar6;
          *(undefined8 *)((long)&pbVar21->field_0 + 8) = uVar7;
        }
        pbVar21 = pbVar21 + 1;
      }
      else {
        uVar3 = *(uint *)((long)__s + (ulong)uVar26 * 4);
        iVar22 = -local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar3 >> 1];
        if ((uVar3 & 1) == 0) {
          iVar22 = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar3 >> 1];
        }
        if (iVar22 < 0) {
          pbVar2 = (byte *)((long)&pbVar31->field_1 + 6);
          *pbVar2 = *pbVar2 | 8;
          goto LAB_00174c9d;
        }
      }
      pbVar31 = pbVar31 + 1;
      uVar26 = uVar26 + 1;
    } while (pbVar31 != pbVar5);
  }
  pbVar5 = (this_00->m_faces).
           super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((pbVar21 != pbVar5) &&
     (pbVar31 = (this_00->m_faces).
                super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                ._M_impl.super__Vector_impl_data._M_finish,
     pbVar21 = (pointer)((long)pbVar21 + ((long)pbVar31 - (long)pbVar5)), pbVar31 != pbVar21)) {
    (this_00->m_faces).
    super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar21;
  }
  operator_delete__(__s);
  operator_delete__(pvVar30);
  if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
code_r0x00174bcd:
  if (local_d4 == 0) {
    local_d4 = -1;
  }
  if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_58,
               (iterator)
               local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_d4);
  }
  else {
    *local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = local_d4;
    local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish + 1;
  }
  local_c8 = (ulong)((int)local_c8 + 2);
  uVar28 = local_38;
LAB_00174c43:
  uVar28 = uVar28 + 1;
  if (uVar28 == uVar33) goto LAB_00174c4f;
  goto LAB_001748ff;
}

Assistant:

void xr_mesh_builder::remove_back_faces(float normal_tolerance)
{
	generate_vertex_faces();

	size_t num_faces = m_faces.size();

	uint32_t* face_backs = new uint32_t[num_faces];
	xr_uninitialized_fill_n(face_backs, num_faces, BAD_IDX);
	uint32_t face_idx = 0;
	for (b_face_vec_cit it = m_faces.begin(), end = m_faces.end();
			it != end; ++it, ++face_idx) {
		for (uint_fast32_t next = m_vertex_faces[it->v0]; next != BAD_IDX;) {
			b_face& face = m_faces[next];
			if (it->is_back(face, m_normals, normal_tolerance)) {
				face_backs[face_idx] = uint32_t(next & UINT32_MAX);
				face_backs[next] = face_idx;
				break;
			}
			next = face.next_face_idx(it->v0);
		}
	}

	create_edges();

	std::vector<uint32_t> adjacents;
	adjacents.reserve(512);
	std::vector<int> sides;
	sides.reserve(256);

	uint32_t* lgroups = new uint32_t[num_faces];
	xr_uninitialized_fill_n(lgroups, num_faces, BAD_IDX);

	uint32_t lgroup = 0;
	for (size_t k = 0; k != num_faces; ++k) {
		if (face_backs[k] == BAD_IDX || lgroups[k] != BAD_IDX)
			continue;
		int side = 0;
		face_idx = uint32_t(k & UINT32_MAX);
		lgroups[face_idx] = lgroup;
		lgroups[face_backs[face_idx]] = lgroup + 1;
		for (;;) {
			const b_face& face = m_faces[face_idx];
			for (uint_fast32_t i = 3, v0, v1 = face.v0; i != 0; v1 = v0) {
				b_edge* edge = find_edge(v0 = face.v[--i], v1);
				xr_assert(edge && (v0 == edge->v1 || v1 == edge->v1));
				if (edge->size > 4)
					continue;
				for (uint_fast32_t next = edge->face0; next != BAD_IDX;) {
					const b_face& adjacent = m_faces[next];
					if (next != face_idx && next != face_backs[face_idx] &&
							lgroups[next] == BAD_IDX) {
						bool same_layer = adjacent.is_same_layer(v0, v1);
						uint_fast32_t next_back = face_backs[next];
						if (next_back == BAD_IDX) {
							if (edge->size > 3)
								break;
							if (same_layer)
								--side;
							else
								++side;
						} else if (same_layer) {
							adjacents.push_back(uint32_t(next & UINT32_MAX));
							lgroups[next] = lgroup;
							lgroups[next_back] = lgroup + 1;
							break;
						} else {
							adjacents.push_back(uint32_t(next_back & UINT32_MAX));
							lgroups[next_back] = lgroup;
							lgroups[next] = lgroup + 1;
							break;
						}
					}

					// check for endless cycle. It`s in build 2232 l06_rostok
					uint_fast32_t temp = adjacent.next_face_idx(v0, v1);
					if (next == temp)
						break;
					next = temp;
				}
			}
			if (adjacents.empty())
				break;
			face_idx = adjacents.back();
			adjacents.pop_back();

		}
		if (side == 0)
			side = -1;
		sides.push_back(side);
		lgroup += 2;
	}

	face_idx = 0;
	b_face_vec_it last = m_faces.begin();
	for (b_face_vec_it it = last, end = m_faces.end(); it != end; ++it, ++face_idx) {
		if (face_backs[face_idx] != BAD_IDX) {
			int side = sides[(lgroup = lgroups[face_idx])/2];
			if (lgroup & 1)
				side = -side;
			if (side < 0)
				it->surface.flags |= RSF_TWO_SIDED;
			else
				continue;
		}
		if (last != it)
			*last = *it;
		++last;
	}
	m_faces.erase(last, m_faces.end());

	delete[] lgroups;
	delete[] face_backs;
}